

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O2

Element * __thiscall
Rml::ElementDocument::SearchFocusSubtree(ElementDocument *this,Element *element,bool forward)

{
  CanFocus CVar1;
  int iVar2;
  Element *pEVar3;
  int iVar4;
  int i;
  int iVar5;
  
  CVar1 = anon_unknown_0::CanFocusElement(element);
  pEVar3 = element;
  if (CVar1 != Yes) {
    if (CVar1 == NoAndNoChildren) {
LAB_0028e082:
      pEVar3 = (Element *)0x0;
    }
    else {
      iVar4 = -1;
      iVar5 = 0;
      do {
        iVar2 = Element::GetNumChildren(element,false);
        if (iVar2 <= iVar5) goto LAB_0028e082;
        iVar2 = iVar5;
        if (!forward) {
          iVar2 = Element::GetNumChildren(element,false);
          iVar2 = iVar2 + iVar4;
        }
        pEVar3 = Element::GetChild(element,iVar2);
        pEVar3 = SearchFocusSubtree(this,pEVar3,forward);
        iVar5 = iVar5 + 1;
        iVar4 = iVar4 + -1;
      } while (pEVar3 == (Element *)0x0);
    }
  }
  return pEVar3;
}

Assistant:

Element* ElementDocument::SearchFocusSubtree(Element* element, bool forward)
{
	CanFocus can_focus = CanFocusElement(element);
	if (can_focus == CanFocus::Yes)
		return element;
	else if (can_focus == CanFocus::NoAndNoChildren)
		return nullptr;

	for (int i = 0; i < element->GetNumChildren(); i++)
	{
		int child_index = i;
		if (!forward)
			child_index = element->GetNumChildren() - i - 1;
		if (Element* result = SearchFocusSubtree(element->GetChild(child_index), forward))
			return result;
	}

	return nullptr;
}